

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

DdNode * Cudd_Support(DdManager *dd,DdNode *f)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  DdNode *g;
  DdNode *pDVar6;
  uint index;
  DdNode *f_00;
  ulong uVar7;
  
  uVar3 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar3 = dd->sizeZ;
  }
  piVar5 = (int *)malloc((long)(int)uVar3 << 2);
  if (piVar5 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    pDVar6 = (DdNode *)0x0;
  }
  else {
    if (0 < (int)uVar3) {
      memset(piVar5,0,(ulong)uVar3 * 4);
    }
    ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),piVar5);
    ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
    do {
      dd->reordered = 0;
      pDVar6 = dd->one;
      piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      f_00 = pDVar6;
      uVar7 = (ulong)uVar3;
      uVar4 = uVar3;
      if (0 < (int)uVar3) {
        do {
          index = uVar4 - 1;
          if ((long)uVar7 <= (long)dd->size) {
            index = dd->invperm[uVar7 - 1];
          }
          pDVar6 = f_00;
          if (piVar5[(int)index] == 1) {
            g = cuddUniqueInter(dd,index,dd->one,(DdNode *)((ulong)dd->one ^ 1));
            piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar6 = cuddBddAndRecur(dd,f_00,g);
            if (pDVar6 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,f_00);
              Cudd_RecursiveDeref(dd,g);
              pDVar6 = (DdNode *)0x0;
              break;
            }
            piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,f_00);
            Cudd_RecursiveDeref(dd,g);
          }
          bVar2 = 1 < (long)uVar7;
          f_00 = pDVar6;
          uVar7 = uVar7 - 1;
          uVar4 = uVar4 - 1;
        } while (bVar2);
      }
    } while (dd->reordered == 1);
    free(piVar5);
    if (pDVar6 != (DdNode *)0x0) {
      piVar5 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
      *piVar5 = *piVar5 + -1;
    }
  }
  return pDVar6;
}

Assistant:

DdNode *
Cudd_Support(
  DdManager * dd /* manager */,
  DdNode * f /* DD whose support is sought */)
{
    int *support;
    DdNode *res, *tmp, *var;
    int i,j;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    ddSupportStep(Cudd_Regular(f),support);
    ddClearFlag(Cudd_Regular(f));

    /* Transform support from array to cube. */
    do {
        dd->reordered = 0;
        res = DD_ONE(dd);
        cuddRef(res);
        for (j = size - 1; j >= 0; j--) { /* for each level bottom-up */
            i = (j >= dd->size) ? j : dd->invperm[j];
            if (support[i] == 1) {
                /* The following call to cuddUniqueInter is guaranteed
                ** not to trigger reordering because the node we look up
                ** already exists. */
                var = cuddUniqueInter(dd,i,dd->one,Cudd_Not(dd->one));
                cuddRef(var);
                tmp = cuddBddAndRecur(dd,res,var);
                if (tmp == NULL) {
                    Cudd_RecursiveDeref(dd,res);
                    Cudd_RecursiveDeref(dd,var);
                    res = NULL;
                    break;
                }
                cuddRef(tmp);
                Cudd_RecursiveDeref(dd,res);
                Cudd_RecursiveDeref(dd,var);
                res = tmp;
            }
        }
    } while (dd->reordered == 1);

    ABC_FREE(support);
    if (res != NULL) cuddDeref(res);
    return(res);

}